

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar6;
  uint uVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar8;
  ulong uVar9;
  value_type vVar10;
  
  pFVar8 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar8->fadexpr_).right_;
  uVar7 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar1 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar7) {
    uVar1 = uVar7;
  }
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00f4819b;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00f4819b;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar8 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar5;
    pFVar6 = (pFVar8->fadexpr_).right_;
    uVar7 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  }
  if (((uVar7 == 0) || ((((pFVar6->fadexpr_).right_)->dx_).num_elts == 0)) ||
     ((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar9);
        pdVar5[uVar9] = vVar10;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  else if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
               ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar9);
      pdVar5[uVar9] = vVar10;
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
LAB_00f4819b:
  pFVar8 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar6 = (pFVar8->fadexpr_).right_;
  pFVar4 = (pFVar6->fadexpr_).left_;
  this->val_ = ((pFVar3->fadexpr_).left_.constant_ + ((pFVar3->fadexpr_).right_)->val_) *
               ((pFVar4->fadexpr_).left_.constant_ * ((pFVar4->fadexpr_).right_)->val_ -
               ((pFVar6->fadexpr_).right_)->val_) * (pFVar8->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}